

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O3

int __thiscall ncnn::Gemm_x86_avx512::create_pipeline_int8(Gemm_x86_avx512 *this,Option *opt)

{
  Mat *pMVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  Allocator *pAVar4;
  size_t sVar5;
  uint uVar6;
  Option *pOVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  int *piVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  undefined1 *puVar26;
  long lVar27;
  uint uVar28;
  undefined1 *puVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  long lVar35;
  uint uVar36;
  long lVar37;
  long lVar38;
  undefined8 *puVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM1 [64];
  long local_e0;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  ulong local_c8;
  undefined8 local_c0;
  long local_b8;
  Gemm_x86_avx512 *local_b0;
  Option *local_a8;
  long local_a0;
  Mat local_98;
  ulong local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_b0 = this;
  local_a8 = opt;
  if ((this->super_Gemm).constantA == 0) {
LAB_0048c20b:
    if ((this->super_Gemm).constantB != 0) {
      uVar10 = (this->super_Gemm).constantN;
      iVar11 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk_int8
                (0,uVar10,iVar11,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,local_a8->num_threads);
      uVar28 = TILE_K;
      uVar8 = (int)(uVar10 + TILE_N + -1) / TILE_N;
      local_50 = (ulong)uVar10;
      Mat::create(&this->BT_data,TILE_N * TILE_K,(TILE_K + iVar11 + -1) / TILE_K,uVar8,1,
                  (Allocator *)0x0);
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_0048ce92;
      if (0 < (int)uVar8) {
        pMVar1 = &(this->super_Gemm).B_data;
        uVar12 = 0;
        do {
          local_c8 = uVar12;
          if (0 < iVar11) {
            iVar30 = TILE_N * (int)uVar12;
            local_b8 = CONCAT44(local_b8._4_4_,(int)local_50 - iVar30);
            lVar19 = (long)iVar30;
            iVar21 = 0;
            do {
              uVar10 = (uint)local_b8;
              if (TILE_N < (int)(uint)local_b8) {
                uVar10 = TILE_N;
              }
              uVar36 = iVar11 - iVar21;
              uVar6 = uVar36;
              if ((int)uVar28 < (int)uVar36) {
                uVar6 = uVar28;
              }
              local_98.elemsize = (this->BT_data).elemsize;
              local_98.w = (this->BT_data).w;
              local_98.cstep = (size_t)local_98.w;
              local_98.elempack = (this->BT_data).elempack;
              local_98.allocator = (this->BT_data).allocator;
              local_98.data =
                   (void *)((long)(this->BT_data).data +
                           local_98.elemsize * local_98.cstep * (long)(iVar21 / (int)uVar28) +
                           (long)(iVar30 / TILE_N) * (this->BT_data).cstep * local_98.elemsize);
              local_98.refcount = (int *)0x0;
              local_98.dims = 2;
              local_98.h = 1;
              local_98.d = 1;
              local_98.c = 1;
              if ((this->super_Gemm).transB == 0) {
                in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                iVar9 = cpu_support_x86_avx512_vnni();
                if (iVar9 == 0) {
                  iVar9 = cpu_support_x86_avx_vnni_int8();
                  if (iVar9 == 0) {
                    iVar9 = cpu_support_x86_avx_vnni();
                    if (iVar9 == 0) {
                      iVar9 = (this->super_Gemm).B_data.w;
                      lVar25 = (long)iVar9;
                      uVar12 = 0;
                      pauVar13 = (undefined1 (*) [32])local_98.data;
                      if (0xf < (int)uVar10) {
                        uVar15 = 0;
                        do {
                          pvVar3 = (this->super_Gemm).B_data.data;
                          lVar27 = (long)(this->super_Gemm).B_data.w * (long)iVar21 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar6 < 2) {
                            pauVar33 = (undefined1 (*) [16])
                                       ((long)pvVar3 + lVar27 + lVar19 + uVar15);
                            uVar28 = 0;
                          }
                          else {
                            lVar27 = (long)pvVar3 + lVar27 + uVar15;
                            iVar16 = 1;
                            do {
                              auVar41 = *(undefined1 (*) [16])(lVar27 + lVar19 + lVar25);
                              in_ZMM1 = ZEXT1664(auVar41);
                              auVar45 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar27 + lVar19),
                                                       auVar41);
                              auVar41 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar27 + lVar19),
                                                       auVar41);
                              *(undefined1 (*) [16])*pauVar13 = auVar45;
                              *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar41;
                              pauVar13 = pauVar13 + 1;
                              lVar27 = lVar27 + iVar9 * 2;
                              iVar16 = iVar16 + 2;
                            } while (iVar16 < (int)uVar6);
                            pauVar33 = (undefined1 (*) [16])(lVar27 + lVar19);
                            uVar28 = uVar6 & 0xfffffffe;
                          }
                          iVar16 = uVar6 - uVar28;
                          if (iVar16 != 0 && (int)uVar28 <= (int)uVar6) {
                            do {
                              *(undefined1 (*) [16])*pauVar13 = *pauVar33;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                              pauVar33 = (undefined1 (*) [16])(*pauVar33 + lVar25);
                              iVar16 = iVar16 + -1;
                            } while (iVar16 != 0);
                          }
                          uVar12 = uVar15 + 0x10;
                          uVar24 = uVar15 + 0x1f;
                          uVar15 = uVar12;
                        } while (uVar24 < uVar10);
                      }
                      if ((int)((uint)uVar12 | 7) < (int)uVar10) {
                        lVar27 = lVar19 + (uVar12 & 0xffffffff);
                        lVar31 = lVar27 + lVar25;
                        uVar15 = uVar12 & 0xffffffff;
                        do {
                          pvVar3 = (this->super_Gemm).B_data.data;
                          lVar17 = (long)(this->super_Gemm).B_data.w * (long)iVar21 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar6 < 2) {
                            lVar34 = (long)pvVar3 + lVar19 + uVar15;
                            uVar28 = 0;
                          }
                          else {
                            lVar34 = (long)pvVar3 + lVar27;
                            lVar38 = (long)pvVar3 + lVar31;
                            iVar16 = 1;
                            do {
                              in_ZMM1 = ZEXT864(*(ulong *)(lVar38 + lVar17));
                              auVar44._8_8_ = 0;
                              auVar44._0_8_ = *(ulong *)(lVar34 + lVar17);
                              auVar46._8_8_ = 0;
                              auVar46._0_8_ = *(ulong *)(lVar38 + lVar17);
                              auVar41 = vpunpcklbw_avx(auVar44,auVar46);
                              *(undefined1 (*) [16])*pauVar13 = auVar41;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                              iVar16 = iVar16 + 2;
                              lVar34 = lVar34 + iVar9 * 2;
                              lVar38 = lVar38 + iVar9 * 2;
                              uVar28 = uVar6 & 0xfffffffe;
                            } while (iVar16 < (int)uVar6);
                          }
                          puVar39 = (undefined8 *)(lVar34 + lVar17);
                          iVar16 = uVar6 - uVar28;
                          if (iVar16 != 0 && (int)uVar28 <= (int)uVar6) {
                            do {
                              *(undefined8 *)*pauVar13 = *puVar39;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 8);
                              puVar39 = (undefined8 *)((long)puVar39 + lVar25);
                              iVar16 = iVar16 + -1;
                            } while (iVar16 != 0);
                          }
                          uVar12 = uVar15 + 8;
                          lVar17 = uVar15 + 0xf;
                          lVar27 = lVar27 + 8;
                          lVar31 = lVar31 + 8;
                          uVar15 = uVar12;
                          this = local_b0;
                        } while (lVar17 < (int)uVar10);
                      }
                      if ((int)((uint)uVar12 | 3) < (int)uVar10) {
                        local_40 = (ulong)iVar21;
                        lVar17 = (long)(iVar9 * 2);
                        local_48 = CONCAT44(local_48._4_4_,uVar6) & 0xfffffffffffffffe;
                        local_38 = (long)(int)uVar10;
                        lVar27 = lVar19 + (uVar12 & 0xffffffff);
                        local_a0 = (iVar9 + 3) + lVar27;
                        lVar31 = (iVar9 + 1) + lVar27;
                        lVar34 = lVar27 + lVar25;
                        uVar15 = uVar12 & 0xffffffff;
                        uVar24 = (iVar9 + 2) + lVar27;
                        do {
                          local_c0 = uVar24;
                          pvVar3 = (this->super_Gemm).B_data.data;
                          lVar38 = (long)(this->super_Gemm).B_data.w * local_40 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar6 < 2) {
                            lVar18 = (long)pvVar3 + lVar19 + uVar15;
                            iVar16 = 0;
                          }
                          else {
                            lVar18 = lVar27 + (long)pvVar3;
                            lVar35 = local_a0 + (long)pvVar3;
                            lVar20 = local_c0 + (long)pvVar3;
                            lVar23 = lVar31 + (long)pvVar3;
                            lVar37 = (long)pvVar3 + lVar34;
                            iVar16 = 1;
                            do {
                              (*pauVar13)[0] = *(undefined1 *)(lVar18 + lVar38);
                              (*pauVar13)[1] = *(undefined1 *)(lVar37 + lVar38);
                              (*pauVar13)[2] = *(undefined1 *)(lVar18 + 1 + lVar38);
                              (*pauVar13)[3] = *(undefined1 *)(lVar23 + lVar38);
                              (*pauVar13)[4] = *(undefined1 *)(lVar18 + 2 + lVar38);
                              (*pauVar13)[5] = *(undefined1 *)(lVar20 + lVar38);
                              (*pauVar13)[6] = *(undefined1 *)(lVar18 + 3 + lVar38);
                              (*pauVar13)[7] = *(undefined1 *)(lVar35 + lVar38);
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 8);
                              iVar16 = iVar16 + 2;
                              lVar18 = lVar18 + lVar17;
                              lVar35 = lVar35 + lVar17;
                              lVar20 = lVar20 + lVar17;
                              lVar23 = lVar23 + lVar17;
                              lVar37 = lVar37 + lVar17;
                            } while (iVar16 < (int)uVar6);
                            this = local_b0;
                            iVar16 = (int)local_48;
                          }
                          iVar22 = uVar6 - iVar16;
                          if (iVar22 != 0 && iVar16 <= (int)uVar6) {
                            puVar26 = (undefined1 *)(lVar18 + lVar38 + 3);
                            do {
                              (*pauVar13)[0] = puVar26[-3];
                              (*pauVar13)[1] = puVar26[-2];
                              (*pauVar13)[2] = puVar26[-1];
                              (*pauVar13)[3] = *puVar26;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
                              puVar26 = puVar26 + lVar25;
                              iVar22 = iVar22 + -1;
                            } while (iVar22 != 0);
                          }
                          uVar12 = uVar15 + 4;
                          lVar38 = uVar15 + 7;
                          lVar27 = lVar27 + 4;
                          local_a0 = local_a0 + 4;
                          lVar31 = lVar31 + 4;
                          lVar34 = lVar34 + 4;
                          uVar15 = uVar12;
                          uVar24 = local_c0 + 4;
                        } while (lVar38 < local_38);
                      }
                      uVar28 = (uint)uVar12;
                      if ((int)(uVar28 | 1) < (int)uVar10) {
                        lVar34 = (long)(iVar9 * 2);
                        local_c0 = CONCAT44(local_c0._4_4_,uVar6) & 0xfffffffffffffffe;
                        lVar27 = lVar19 + (int)uVar28;
                        lVar17 = (iVar9 + 1) + lVar27;
                        lVar31 = lVar27 + lVar25;
                        uVar15 = (long)(int)uVar28;
                        do {
                          pvVar3 = (this->super_Gemm).B_data.data;
                          lVar38 = (long)(this->super_Gemm).B_data.w * (long)iVar21 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar6 < 2) {
                            lVar18 = (long)pvVar3 + lVar19 + uVar15;
                            iVar9 = 0;
                          }
                          else {
                            lVar18 = lVar27 + (long)pvVar3;
                            lVar35 = lVar17 + (long)pvVar3;
                            lVar20 = (long)pvVar3 + lVar31;
                            iVar9 = 1;
                            do {
                              (*pauVar13)[0] = *(undefined1 *)(lVar18 + lVar38);
                              (*pauVar13)[1] = *(undefined1 *)(lVar20 + lVar38);
                              (*pauVar13)[2] = *(undefined1 *)(lVar18 + 1 + lVar38);
                              (*pauVar13)[3] = *(undefined1 *)(lVar35 + lVar38);
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
                              iVar9 = iVar9 + 2;
                              lVar18 = lVar18 + lVar34;
                              lVar35 = lVar35 + lVar34;
                              lVar20 = lVar20 + lVar34;
                            } while (iVar9 < (int)uVar6);
                            this = local_b0;
                            iVar9 = (int)local_c0;
                          }
                          iVar16 = uVar6 - iVar9;
                          if (iVar16 != 0 && iVar9 <= (int)uVar6) {
                            puVar26 = (undefined1 *)(lVar18 + lVar38 + 1);
                            do {
                              (*pauVar13)[0] = puVar26[-1];
                              (*pauVar13)[1] = *puVar26;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 2);
                              puVar26 = puVar26 + lVar25;
                              iVar16 = iVar16 + -1;
                            } while (iVar16 != 0);
                          }
                          uVar12 = uVar15 + 2;
                          lVar38 = uVar15 + 3;
                          lVar27 = lVar27 + 2;
                          lVar17 = lVar17 + 2;
                          lVar31 = lVar31 + 2;
                          uVar15 = uVar12;
                        } while (lVar38 < (int)uVar10);
                      }
                      if ((int)uVar12 < (int)uVar10) {
                        lVar27 = (long)(int)uVar12;
                        do {
                          if (0 < (int)uVar6) {
                            puVar26 = (undefined1 *)
                                      ((long)(this->super_Gemm).B_data.data +
                                      lVar19 + lVar27 +
                                      (long)(this->super_Gemm).B_data.w * (long)iVar21 *
                                      (this->super_Gemm).B_data.elemsize);
                            uVar28 = uVar6;
                            do {
                              (*pauVar13)[0] = *puVar26;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 1);
                              puVar26 = puVar26 + lVar25;
                              uVar28 = uVar28 - 1;
                            } while (uVar28 != 0);
                          }
                          lVar27 = lVar27 + 1;
                        } while (lVar27 != (int)uVar10);
                      }
                    }
                    else {
                      transpose_pack_B_tile_int8_avxvnni
                                (pMVar1,&local_98,iVar30,uVar10,iVar21,uVar6);
                    }
                  }
                  else {
                    transpose_pack_B_tile_int8_avxvnniint8
                              (pMVar1,&local_98,iVar30,uVar10,iVar21,uVar6);
                  }
                }
                else {
                  transpose_pack_B_tile_int8_avx512vnni(pMVar1,&local_98,iVar30,uVar10,iVar21,uVar6)
                  ;
                }
              }
              else {
                in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                iVar9 = cpu_support_x86_avx512_vnni();
                if (iVar9 == 0) {
                  iVar9 = cpu_support_x86_avx_vnni_int8();
                  if (iVar9 == 0) {
                    iVar9 = cpu_support_x86_avx_vnni();
                    if (iVar9 == 0) {
                      uVar12 = 0;
                      pauVar13 = (undefined1 (*) [32])local_98.data;
                      if (0xf < (int)uVar10) {
                        uVar15 = 0;
                        do {
                          lVar25 = (long)(this->super_Gemm).B_data.data +
                                   (long)iVar21 +
                                   (lVar19 + uVar15) * (long)(this->super_Gemm).B_data.w *
                                   (this->super_Gemm).B_data.elemsize;
                          auVar43 = vpbroadcastd_avx512f();
                          vpmulld_avx512f(auVar43,_DAT_005b1c00);
                          uVar32 = 0;
                          if (1 < (int)uVar6) {
                            iVar9 = 1;
                            do {
                              in_ZMM1 = vpgatherdd_avx512f(*(undefined4 *)(*pauVar13 + lVar25));
                              auVar42 = vpmovdw_avx512f(in_ZMM1);
                              *pauVar13 = auVar42;
                              pauVar13 = pauVar13 + 1;
                              lVar25 = lVar25 + 2;
                              iVar9 = iVar9 + 2;
                              uVar32 = uVar6 & 0xfffffffe;
                            } while (iVar9 < (int)uVar6);
                          }
                          iVar9 = uVar6 - uVar32;
                          if (iVar9 != 0 && (int)uVar32 <= (int)uVar6) {
                            do {
                              in_ZMM1 = vpgatherdd_avx512f(*(undefined4 *)(*pauVar13 + lVar25));
                              auVar41 = vpmovdb_avx512f(in_ZMM1);
                              *(undefined1 (*) [16])*pauVar13 = auVar41;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                              lVar25 = lVar25 + 1;
                              iVar9 = iVar9 + -1;
                            } while (iVar9 != 0);
                          }
                          uVar12 = uVar15 + 0x10;
                          uVar24 = uVar15 + 0x1f;
                          uVar15 = uVar12;
                        } while (uVar24 < uVar10);
                      }
                      if ((int)((uint)uVar12 | 7) < (int)uVar10) {
                        uVar15 = uVar12 & 0xffffffff;
                        do {
                          auVar42 = vpbroadcastd_avx512vl();
                          vpmulld_avx2(auVar42,_DAT_005a6e60);
                          uVar32 = 0;
                          if (1 < (int)uVar6) {
                            iVar9 = 1;
                            do {
                              auVar42 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
                              auVar42 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar42);
                              in_ZMM1 = ZEXT3264((undefined1  [32])0x0);
                              auVar41 = vpmovdw_avx512vl(auVar42);
                              *(undefined1 (*) [16])*pauVar13 = auVar41;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                              iVar9 = iVar9 + 2;
                              uVar32 = uVar6 & 0xfffffffe;
                            } while (iVar9 < (int)uVar6);
                          }
                          iVar9 = uVar6 - uVar32;
                          if (iVar9 != 0 && (int)uVar32 <= (int)uVar6) {
                            do {
                              auVar42 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
                              auVar42 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar42);
                              in_ZMM1 = ZEXT3264((undefined1  [32])0x0);
                              auVar41 = vpmovdb_avx512vl(auVar42);
                              *(long *)*pauVar13 = auVar41._0_8_;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 8);
                              iVar9 = iVar9 + -1;
                            } while (iVar9 != 0);
                          }
                          uVar12 = uVar15 + 8;
                          lVar25 = uVar15 + 0xf;
                          uVar15 = uVar12;
                        } while (lVar25 < (int)uVar10);
                      }
                      if ((int)((uint)uVar12 | 3) < (int)uVar10) {
                        uVar15 = uVar12 & 0xffffffff;
                        do {
                          auVar41 = vpbroadcastd_avx512vl();
                          vpmulld_avx(auVar41,_DAT_005a5490);
                          uVar32 = 0;
                          if (1 < (int)uVar6) {
                            iVar9 = 1;
                            do {
                              auVar41 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
                              auVar41 = vpgatherdd((undefined1  [16])0x0,auVar41);
                              in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
                              auVar41 = vpmovdw_avx512vl(auVar41);
                              *(long *)*pauVar13 = auVar41._0_8_;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 8);
                              iVar9 = iVar9 + 2;
                              uVar32 = uVar6 & 0xfffffffe;
                            } while (iVar9 < (int)uVar6);
                          }
                          iVar9 = uVar6 - uVar32;
                          if (iVar9 != 0 && (int)uVar32 <= (int)uVar6) {
                            do {
                              auVar41 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
                              auVar41 = vpgatherdd((undefined1  [16])0x0,auVar41);
                              in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
                              auVar41 = vpmovdb_avx512vl(auVar41);
                              *(int *)*pauVar13 = auVar41._0_4_;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
                              iVar9 = iVar9 + -1;
                            } while (iVar9 != 0);
                          }
                          uVar12 = uVar15 + 4;
                          lVar25 = uVar15 + 7;
                          uVar15 = uVar12;
                        } while (lVar25 < (int)uVar10);
                      }
                      if ((int)((uint)uVar12 | 1) < (int)uVar10) {
                        uVar15 = (long)(int)(uint)uVar12;
                        do {
                          lVar25 = (long)(this->super_Gemm).B_data.w *
                                   (this->super_Gemm).B_data.elemsize;
                          pvVar3 = (this->super_Gemm).B_data.data;
                          puVar26 = (undefined1 *)
                                    ((long)pvVar3 + (uVar15 + lVar19) * lVar25 + (long)iVar21);
                          puVar29 = (undefined1 *)
                                    ((long)pvVar3 + (lVar19 + uVar15 + 1) * lVar25 + (long)iVar21);
                          uVar32 = 0;
                          if (1 < (int)uVar6) {
                            iVar9 = 1;
                            do {
                              (*pauVar13)[0] = *puVar26;
                              (*pauVar13)[1] = puVar26[1];
                              (*pauVar13)[2] = *puVar29;
                              (*pauVar13)[3] = puVar29[1];
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
                              puVar26 = puVar26 + 2;
                              puVar29 = puVar29 + 2;
                              iVar9 = iVar9 + 2;
                              uVar32 = uVar6 & 0xfffffffe;
                            } while (iVar9 < (int)uVar6);
                          }
                          if ((int)uVar32 < (int)uVar6) {
                            lVar25 = 0;
                            do {
                              (*pauVar13)[0] = puVar26[lVar25];
                              (*pauVar13)[1] = puVar29[lVar25];
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 2);
                              lVar25 = lVar25 + 1;
                            } while (uVar6 - uVar32 != (int)lVar25);
                          }
                          uVar12 = uVar15 + 2;
                          lVar25 = uVar15 + 3;
                          uVar15 = uVar12;
                        } while (lVar25 < (int)uVar10);
                      }
                      if ((int)uVar12 < (int)uVar10) {
                        lVar25 = (long)(int)uVar12;
                        if ((int)uVar28 < (int)uVar36) {
                          uVar36 = uVar28;
                        }
                        lVar27 = lVar19 + lVar25;
                        do {
                          if (0 < (int)uVar6) {
                            iVar9 = (this->super_Gemm).B_data.w;
                            pvVar3 = (this->super_Gemm).B_data.data;
                            sVar5 = (this->super_Gemm).B_data.elemsize;
                            lVar31 = 0;
                            do {
                              (*pauVar13)[lVar31] =
                                   *(undefined1 *)
                                    ((long)pvVar3 +
                                    lVar31 + sVar5 * lVar27 * (long)iVar9 + (long)iVar21);
                              lVar31 = lVar31 + 1;
                            } while (uVar36 != (uint)lVar31);
                            pauVar13 = (undefined1 (*) [32])(*pauVar13 + lVar31);
                          }
                          lVar25 = lVar25 + 1;
                          lVar27 = lVar27 + 1;
                        } while (lVar25 != (int)uVar10);
                      }
                    }
                    else {
                      pack_B_tile_int8_avxvnni(pMVar1,&local_98,iVar30,uVar10,iVar21,uVar6);
                    }
                  }
                  else {
                    pack_B_tile_int8_avxvnniint8(pMVar1,&local_98,iVar30,uVar10,iVar21,uVar6);
                  }
                }
                else {
                  pack_B_tile_int8_avx512vnni(pMVar1,&local_98,iVar30,uVar10,iVar21,uVar6);
                }
              }
              if (local_98.refcount != (int *)0x0) {
                LOCK();
                *local_98.refcount = *local_98.refcount + -1;
                UNLOCK();
                if (*local_98.refcount == 0) {
                  if (local_98.allocator == (Allocator *)0x0) {
                    if ((undefined1 (*) [32])local_98.data != (undefined1 (*) [32])0x0) {
                      in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                      free(local_98.data);
                    }
                  }
                  else {
                    in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar21 = iVar21 + TILE_K;
              uVar28 = TILE_K;
            } while (iVar21 < iVar11);
          }
          uVar10 = (int)local_c8 + 1;
          uVar12 = (ulong)uVar10;
        } while (uVar10 != uVar8);
      }
      if (local_a8->lightmode != false) {
        piVar14 = (this->super_Gemm).B_data.refcount;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            pvVar3 = (this->super_Gemm).B_data.data;
            pAVar4 = (this->super_Gemm).B_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).B_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).B_data.data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
    }
    pOVar7 = local_a8;
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar14 = (this->super_Gemm).C_data.refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (this->CT_data).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar3 = (this->CT_data).data;
          pAVar4 = (this->CT_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      auVar2._0_8_ = (this->super_Gemm).C_data.data;
      auVar2._8_8_ = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (void *)auVar2._0_8_;
      (this->CT_data).refcount = (int *)auVar2._8_8_;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar11 = (this->super_Gemm).C_data.w;
      iVar30 = (this->super_Gemm).C_data.h;
      iVar21 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar11;
      (this->CT_data).h = iVar30;
      (this->CT_data).d = iVar21;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (pOVar7->lightmode == true) {
        piVar14 = (int *)vpextrq_avx(auVar2,1);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            pvVar3 = (this->super_Gemm).C_data.data;
            pAVar4 = (this->super_Gemm).C_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).C_data.data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       (iVar11 = 0, (this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = pOVar7->num_threads;
      iVar11 = 0;
    }
  }
  else {
    uVar10 = (this->super_Gemm).constantM;
    iVar11 = (this->super_Gemm).constantK;
    get_optimal_tile_mnk_int8
              (uVar10,0,iVar11,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N
               ,(this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar30 = TILE_M;
    uVar28 = TILE_K;
    uVar8 = (int)(TILE_M + uVar10 + -1) / TILE_M;
    iVar21 = uVar28;
    local_50 = (ulong)uVar10;
    if (3 < TILE_K) {
      iVar9 = cpu_support_x86_avx512_vnni();
      bVar40 = true;
      if (iVar9 == 0) {
        iVar9 = cpu_support_x86_avx_vnni();
        bVar40 = iVar9 != 0;
      }
      iVar9 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar40 ^ 1U | iVar9 != 0)) {
        iVar21 = 0x40;
        if (((iVar30 < 0x10) && (iVar21 = 0x20, iVar30 < 8)) && (iVar21 = 0x10, iVar30 < 4)) {
          iVar21 = (uint)(1 < iVar30) * 4 + 4;
        }
        iVar21 = iVar21 + uVar28;
      }
    }
    Mat::create(&this->AT_data,iVar21 * iVar30,(int)(iVar11 + uVar28 + -1) / (int)uVar28,uVar8,1,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      if (0 < (int)uVar8) {
        pMVar1 = &(this->super_Gemm).A_data;
        uVar12 = 0;
        do {
          local_48 = uVar12;
          if (0 < iVar11) {
            iVar21 = TILE_M * (int)uVar12;
            uVar10 = (int)local_50 - iVar21;
            lVar19 = (long)iVar21;
            iVar30 = 0;
            do {
              uVar6 = uVar10;
              if (TILE_M < (int)uVar10) {
                uVar6 = TILE_M;
              }
              uVar36 = iVar11 - iVar30;
              if ((int)uVar28 < iVar11 - iVar30) {
                uVar36 = uVar28;
              }
              local_98.elemsize = (this->AT_data).elemsize;
              local_98.w = (this->AT_data).w;
              local_98.cstep = (size_t)local_98.w;
              local_98.elempack = (this->AT_data).elempack;
              local_98.allocator = (this->AT_data).allocator;
              local_98.data =
                   (void *)((long)(this->AT_data).data +
                           local_98.elemsize * local_98.cstep * (long)(iVar30 / (int)uVar28) +
                           (long)(iVar21 / TILE_M) * (this->AT_data).cstep * local_98.elemsize);
              local_98.refcount = (int *)0x0;
              local_98.dims = 2;
              local_98.h = 1;
              local_98.d = 1;
              local_98.c = 1;
              if ((this->super_Gemm).transA == 0) {
                pack_A_tile_int8(pMVar1,&local_98,iVar21,uVar6,iVar30,uVar36);
              }
              else {
                iVar9 = cpu_support_x86_avx512_vnni();
                if (iVar9 == 0) {
                  iVar9 = cpu_support_x86_avx_vnni_int8();
                  if (iVar9 == 0) {
                    iVar9 = cpu_support_x86_avx_vnni();
                    if (iVar9 == 0) {
                      iVar9 = (this->super_Gemm).A_data.w;
                      lVar25 = (long)iVar9;
                      uVar12 = 0;
                      pauVar13 = (undefined1 (*) [32])local_98.data;
                      if (0xf < (int)uVar6) {
                        uVar15 = 0;
                        do {
                          pvVar3 = (this->super_Gemm).A_data.data;
                          lVar27 = (long)(this->super_Gemm).A_data.w * (long)iVar30 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)uVar36 < 2) {
                            pauVar33 = (undefined1 (*) [16])
                                       ((long)pvVar3 + lVar27 + lVar19 + uVar15);
                            uVar28 = 0;
                          }
                          else {
                            lVar27 = (long)pvVar3 + lVar27 + uVar15;
                            iVar16 = 1;
                            do {
                              auVar41 = *(undefined1 (*) [16])(lVar27 + lVar25 + lVar19);
                              in_ZMM1 = ZEXT1664(auVar41);
                              auVar45 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar27 + lVar19),
                                                       auVar41);
                              auVar41 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar27 + lVar19),
                                                       auVar41);
                              *(undefined1 (*) [16])*pauVar13 = auVar45;
                              *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar41;
                              pauVar13 = pauVar13 + 1;
                              lVar27 = lVar27 + iVar9 * 2;
                              iVar16 = iVar16 + 2;
                            } while (iVar16 < (int)uVar36);
                            pauVar33 = (undefined1 (*) [16])(lVar27 + lVar19);
                            uVar28 = uVar36 & 0xfffffffe;
                          }
                          iVar16 = uVar36 - uVar28;
                          if (iVar16 != 0 && (int)uVar28 <= (int)uVar36) {
                            do {
                              *(undefined1 (*) [16])*pauVar13 = *pauVar33;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                              pauVar33 = (undefined1 (*) [16])(*pauVar33 + lVar25);
                              iVar16 = iVar16 + -1;
                            } while (iVar16 != 0);
                          }
                          uVar12 = uVar15 + 0x10;
                          uVar24 = uVar15 + 0x1f;
                          uVar15 = uVar12;
                        } while (uVar24 < uVar6);
                      }
                      local_c8 = CONCAT44(local_c8._4_4_,uVar6);
                      if ((int)((uint)uVar12 | 7) < (int)uVar6) {
                        lVar27 = (uVar12 & 0xffffffff) + lVar19;
                        lVar31 = lVar27 + lVar25;
                        uVar15 = uVar12 & 0xffffffff;
                        do {
                          pvVar3 = (this->super_Gemm).A_data.data;
                          lVar17 = (long)(this->super_Gemm).A_data.w * (long)iVar30 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)uVar36 < 2) {
                            lVar34 = (long)pvVar3 + lVar19 + uVar15;
                            uVar28 = 0;
                          }
                          else {
                            lVar34 = (long)pvVar3 + lVar27;
                            lVar38 = (long)pvVar3 + lVar31;
                            iVar16 = 1;
                            do {
                              in_ZMM1 = ZEXT864(*(ulong *)(lVar38 + lVar17));
                              auVar41._8_8_ = 0;
                              auVar41._0_8_ = *(ulong *)(lVar34 + lVar17);
                              auVar45._8_8_ = 0;
                              auVar45._0_8_ = *(ulong *)(lVar38 + lVar17);
                              auVar41 = vpunpcklbw_avx(auVar41,auVar45);
                              *(undefined1 (*) [16])*pauVar13 = auVar41;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                              iVar16 = iVar16 + 2;
                              lVar34 = lVar34 + iVar9 * 2;
                              lVar38 = lVar38 + iVar9 * 2;
                              uVar28 = uVar36 & 0xfffffffe;
                            } while (iVar16 < (int)uVar36);
                          }
                          puVar39 = (undefined8 *)(lVar34 + lVar17);
                          iVar16 = uVar36 - uVar28;
                          if (iVar16 != 0 && (int)uVar28 <= (int)uVar36) {
                            do {
                              *(undefined8 *)*pauVar13 = *puVar39;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 8);
                              puVar39 = (undefined8 *)((long)puVar39 + lVar25);
                              iVar16 = iVar16 + -1;
                            } while (iVar16 != 0);
                          }
                          uVar12 = uVar15 + 8;
                          lVar17 = uVar15 + 0xf;
                          lVar27 = lVar27 + 8;
                          lVar31 = lVar31 + 8;
                          uVar15 = uVar12;
                        } while (lVar17 < (int)uVar6);
                      }
                      if ((int)((uint)uVar12 | 3) < (int)uVar6) {
                        local_38 = (long)iVar30;
                        lVar38 = (long)(iVar9 * 2);
                        local_40 = CONCAT44(local_40._4_4_,uVar36) & 0xfffffffffffffffe;
                        local_c0 = (ulong)(int)uVar6;
                        lVar27 = (uVar12 & 0xffffffff) + lVar19;
                        local_e0 = (iVar9 + 3) + lVar27;
                        lVar34 = (iVar9 + 1) + lVar27;
                        lVar17 = lVar27 + lVar25;
                        lVar31 = (iVar9 + 2) + lVar27;
                        uVar15 = uVar12 & 0xffffffff;
                        do {
                          local_b8 = lVar31;
                          pvVar3 = (this->super_Gemm).A_data.data;
                          lVar31 = (this->super_Gemm).A_data.w * local_38 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)uVar36 < 2) {
                            lVar18 = (long)pvVar3 + lVar19 + uVar15;
                            iVar16 = 0;
                          }
                          else {
                            lVar18 = (long)pvVar3 + lVar27;
                            lVar35 = (long)pvVar3 + local_e0;
                            lVar20 = (long)pvVar3 + local_b8;
                            lVar23 = lVar34 + (long)pvVar3;
                            lVar37 = (long)pvVar3 + lVar17;
                            iVar16 = 1;
                            do {
                              (*pauVar13)[0] = *(undefined1 *)(lVar18 + lVar31);
                              (*pauVar13)[1] = *(undefined1 *)(lVar37 + lVar31);
                              (*pauVar13)[2] = *(undefined1 *)(lVar18 + 1 + lVar31);
                              (*pauVar13)[3] = *(undefined1 *)(lVar23 + lVar31);
                              (*pauVar13)[4] = *(undefined1 *)(lVar18 + 2 + lVar31);
                              (*pauVar13)[5] = *(undefined1 *)(lVar20 + lVar31);
                              (*pauVar13)[6] = *(undefined1 *)(lVar18 + 3 + lVar31);
                              (*pauVar13)[7] = *(undefined1 *)(lVar35 + lVar31);
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 8);
                              iVar16 = iVar16 + 2;
                              lVar18 = lVar18 + lVar38;
                              lVar35 = lVar35 + lVar38;
                              lVar20 = lVar20 + lVar38;
                              lVar23 = lVar23 + lVar38;
                              lVar37 = lVar37 + lVar38;
                            } while (iVar16 < (int)uVar36);
                            iVar16 = (int)local_40;
                            local_a0 = lVar34;
                          }
                          iVar22 = uVar36 - iVar16;
                          if (iVar22 != 0 && iVar16 <= (int)uVar36) {
                            puVar26 = (undefined1 *)(lVar18 + lVar31 + 3);
                            do {
                              (*pauVar13)[0] = puVar26[-3];
                              (*pauVar13)[1] = puVar26[-2];
                              (*pauVar13)[2] = puVar26[-1];
                              (*pauVar13)[3] = *puVar26;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
                              puVar26 = puVar26 + lVar25;
                              iVar22 = iVar22 + -1;
                            } while (iVar22 != 0);
                          }
                          uVar12 = uVar15 + 4;
                          lVar18 = uVar15 + 7;
                          lVar27 = lVar27 + 4;
                          local_e0 = local_e0 + 4;
                          lVar34 = lVar34 + 4;
                          lVar17 = lVar17 + 4;
                          lVar31 = local_b8 + 4;
                          uVar15 = uVar12;
                          this = local_b0;
                        } while (lVar18 < (long)local_c0);
                      }
                      uVar28 = (uint)uVar12;
                      if ((int)(uVar28 | 1) < (int)uVar6) {
                        local_b8 = (long)iVar30;
                        lVar34 = (long)(iVar9 * 2);
                        lVar27 = (int)uVar28 + lVar19;
                        lVar17 = (iVar9 + 1) + lVar27;
                        lVar31 = lVar27 + lVar25;
                        uVar15 = (long)(int)uVar28;
                        do {
                          pvVar3 = (this->super_Gemm).A_data.data;
                          lVar38 = (this->super_Gemm).A_data.w * local_b8 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)uVar36 < 2) {
                            lVar18 = (long)pvVar3 + lVar19 + uVar15;
                            uVar28 = 0;
                          }
                          else {
                            lVar18 = (long)pvVar3 + lVar27;
                            lVar35 = (long)pvVar3 + lVar17;
                            lVar20 = (long)pvVar3 + lVar31;
                            iVar9 = 1;
                            do {
                              (*pauVar13)[0] = *(undefined1 *)(lVar18 + lVar38);
                              (*pauVar13)[1] = *(undefined1 *)(lVar20 + lVar38);
                              (*pauVar13)[2] = *(undefined1 *)(lVar18 + 1 + lVar38);
                              (*pauVar13)[3] = *(undefined1 *)(lVar35 + lVar38);
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
                              iVar9 = iVar9 + 2;
                              lVar18 = lVar18 + lVar34;
                              lVar35 = lVar35 + lVar34;
                              lVar20 = lVar20 + lVar34;
                              this = local_b0;
                              uVar28 = uVar36 & 0xfffffffe;
                            } while (iVar9 < (int)uVar36);
                          }
                          iVar9 = uVar36 - uVar28;
                          if (iVar9 != 0 && (int)uVar28 <= (int)uVar36) {
                            puVar26 = (undefined1 *)(lVar18 + lVar38 + 1);
                            do {
                              (*pauVar13)[0] = puVar26[-1];
                              (*pauVar13)[1] = *puVar26;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 2);
                              puVar26 = puVar26 + lVar25;
                              iVar9 = iVar9 + -1;
                            } while (iVar9 != 0);
                          }
                          uVar12 = uVar15 + 2;
                          lVar38 = uVar15 + 3;
                          lVar27 = lVar27 + 2;
                          lVar17 = lVar17 + 2;
                          lVar31 = lVar31 + 2;
                          uVar15 = uVar12;
                        } while (lVar38 < (int)uVar6);
                      }
                      if ((int)uVar12 < (int)uVar6) {
                        lVar27 = (long)(int)uVar12;
                        do {
                          if (0 < (int)uVar36) {
                            puVar26 = (undefined1 *)
                                      ((long)(this->super_Gemm).A_data.data +
                                      lVar19 + lVar27 + (long)(this->super_Gemm).A_data.w *
                                                        (long)iVar30 *
                                                        (this->super_Gemm).A_data.elemsize);
                            uVar28 = uVar36;
                            do {
                              (*pauVar13)[0] = *puVar26;
                              pauVar13 = (undefined1 (*) [32])(*pauVar13 + 1);
                              puVar26 = puVar26 + lVar25;
                              uVar28 = uVar28 - 1;
                            } while (uVar28 != 0);
                          }
                          lVar27 = lVar27 + 1;
                        } while (lVar27 != (int)uVar6);
                      }
                    }
                    else {
                      transpose_pack_A_tile_int8_avxvnni
                                (pMVar1,&local_98,iVar21,uVar6,iVar30,uVar36);
                    }
                  }
                  else {
                    transpose_pack_A_tile_int8_avxvnniint8
                              (pMVar1,&local_98,iVar21,uVar6,iVar30,uVar36);
                  }
                }
                else {
                  transpose_pack_A_tile_int8_avx512vnni(pMVar1,&local_98,iVar21,uVar6,iVar30,uVar36)
                  ;
                }
              }
              if (local_98.refcount != (int *)0x0) {
                LOCK();
                *local_98.refcount = *local_98.refcount + -1;
                UNLOCK();
                if (*local_98.refcount == 0) {
                  if (local_98.allocator == (Allocator *)0x0) {
                    if ((undefined1 (*) [32])local_98.data != (undefined1 (*) [32])0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar30 = iVar30 + TILE_K;
              uVar28 = TILE_K;
            } while (iVar30 < iVar11);
          }
          uVar10 = (int)local_48 + 1;
          uVar12 = (ulong)uVar10;
        } while (uVar10 != uVar8);
      }
      if (local_a8->lightmode != false) {
        piVar14 = (this->super_Gemm).A_data.refcount;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            pvVar3 = (this->super_Gemm).A_data.data;
            pAVar4 = (this->super_Gemm).A_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).A_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).A_data.data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      goto LAB_0048c20b;
    }
LAB_0048ce92:
    iVar11 = -100;
  }
  return iVar11;
}

Assistant:

int Gemm_x86_avx512::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}